

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaTargetGenerator::WriteTargetDependInfo
          (cmNinjaTargetGenerator *this,string *lang,string *config)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *this_00;
  pointer pbVar2;
  int iVar3;
  Value *pVVar4;
  string *psVar5;
  cmGlobalNinjaGenerator *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  string *i;
  pointer path;
  String *pSVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  LinkedTargetDirs linked_directories;
  Value tdi;
  string mod_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string tdin;
  cmGeneratedFileStream tdif;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  _Any_data local_360;
  undefined1 local_350 [16];
  _Any_data local_340;
  code *local_330;
  code *pcStack_328;
  Value local_320;
  String local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  string local_2b8;
  ValueHolder local_298;
  char *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  pointer local_278;
  undefined8 local_270;
  undefined8 local_268;
  char *local_260;
  undefined8 local_258;
  
  Json::Value::Value(&local_320,objectValue);
  Json::Value::Value((Value *)&local_298,lang);
  pVVar4 = Json::Value::operator[](&local_320,"language");
  Json::Value::operator=(pVVar4,(Value *)&local_298);
  Json::Value::~Value((Value *)&local_298);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  local_298.int_ = 6;
  local_290 = "CMAKE_";
  local_288._M_allocated_capacity = 0;
  local_278 = (lang->_M_dataplus)._M_p;
  local_288._8_8_ = lang->_M_string_length;
  local_270 = 0;
  local_268 = 0xc;
  local_260 = "_COMPILER_ID";
  local_258 = 0;
  views._M_len = 3;
  views._M_array = (iterator)&local_298;
  cmCatViews((string *)local_390,views);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_390);
  Json::Value::Value((Value *)&local_360,psVar5);
  pVVar4 = Json::Value::operator[](&local_320,"compiler-id");
  Json::Value::operator=(pVVar4,(Value *)&local_360);
  Json::Value::~Value((Value *)&local_360);
  if ((String *)local_390._0_8_ != (String *)local_380) {
    operator_delete((void *)local_390._0_8_,local_380._0_8_ + 1);
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  local_298.int_ = 6;
  local_290 = "CMAKE_";
  local_288._M_allocated_capacity = 0;
  local_278 = (lang->_M_dataplus)._M_p;
  local_288._8_8_ = lang->_M_string_length;
  local_270 = 0;
  local_268 = 0xc;
  local_260 = "_SIMULATE_ID";
  local_258 = 0;
  views_00._M_len = 3;
  views_00._M_array = (iterator)&local_298;
  cmCatViews((string *)local_390,views_00);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_390);
  Json::Value::Value((Value *)&local_360,psVar5);
  pVVar4 = Json::Value::operator[](&local_320,"compiler-simulate-id");
  Json::Value::operator=(pVVar4,(Value *)&local_360);
  Json::Value::~Value((Value *)&local_360);
  if ((String *)local_390._0_8_ != (String *)local_380) {
    operator_delete((void *)local_390._0_8_,local_380._0_8_ + 1);
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  local_298.int_ = 6;
  local_290 = "CMAKE_";
  local_288._M_allocated_capacity = 0;
  local_278 = (lang->_M_dataplus)._M_p;
  local_288._8_8_ = lang->_M_string_length;
  local_270 = 0;
  local_268 = 0x1a;
  local_260 = "_COMPILER_FRONTEND_VARIANT";
  local_258 = 0;
  views_01._M_len = 3;
  views_01._M_array = (iterator)&local_298;
  cmCatViews((string *)local_390,views_01);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_390);
  Json::Value::Value((Value *)&local_360,psVar5);
  pVVar4 = Json::Value::operator[](&local_320,"compiler-frontend-variant");
  Json::Value::operator=(pVVar4,(Value *)&local_360);
  Json::Value::~Value((Value *)&local_360);
  if ((String *)local_390._0_8_ != (String *)local_380) {
    operator_delete((void *)local_390._0_8_,local_380._0_8_ + 1);
  }
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  iVar3 = std::__cxx11::string::compare((char *)lang);
  if (iVar3 == 0) {
    this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar5 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).Makefile);
    cmGeneratorTarget::GetFortranModuleDirectory((string *)&local_298,this_00,psVar5);
    std::__cxx11::string::operator=((string *)&local_2f8,(string *)&local_298.bool_);
    uVar7 = local_288._M_allocated_capacity;
    uVar8 = local_298;
    if (local_298 == &local_288) goto LAB_004708f7;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)lang);
    if (iVar3 != 0) goto LAB_004708f7;
    pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmsys::SystemTools::CollapseFullPath
              ((string *)&local_360,
               &((this->super_cmCommonTargetGenerator).GeneratorTarget)->ObjectDirectory);
    (*(pcVar6->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x18])
              (&local_298,pcVar6,&local_360,config);
    std::__cxx11::string::operator=((string *)&local_2f8,(string *)&local_298.bool_);
    if (local_298 != &local_288) {
      operator_delete(local_298.string_,local_288._M_allocated_capacity + 1);
    }
    uVar7 = local_350._0_8_;
    uVar8 = local_360._M_unused._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_unused._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350) goto LAB_004708f7;
  }
  operator_delete((void *)uVar8,uVar7 + 1);
LAB_004708f7:
  if (local_2f8._M_string_length == 0) {
    cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile)
    ;
    std::__cxx11::string::_M_assign((string *)&local_2f8);
  }
  Json::Value::Value((Value *)&local_298,&local_2f8);
  pVVar4 = Json::Value::operator[](&local_320,"module-dir");
  Json::Value::operator=(pVVar4,(Value *)&local_298);
  Json::Value::~Value((Value *)&local_298);
  iVar3 = std::__cxx11::string::compare((char *)lang);
  if (iVar3 == 0) {
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    local_360._M_unused._M_object = local_350;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_360,"CMAKE_Fortran_SUBMODULE_SEP","");
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_360);
    Json::Value::Value((Value *)&local_298,psVar5);
    pVVar4 = Json::Value::operator[](&local_320,"submodule-sep");
    Json::Value::operator=(pVVar4,(Value *)&local_298);
    Json::Value::~Value((Value *)&local_298);
    if ((undefined1 *)local_360._M_unused._0_8_ != local_350) {
      operator_delete(local_360._M_unused._M_object,local_350._0_8_ + 1);
    }
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    local_360._M_unused._M_object = local_350;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_360,"CMAKE_Fortran_SUBMODULE_EXT","");
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_360);
    Json::Value::Value((Value *)&local_298,psVar5);
    pVVar4 = Json::Value::operator[](&local_320,"submodule-ext");
    Json::Value::operator=(pVVar4,(Value *)&local_298);
    Json::Value::~Value((Value *)&local_298);
    if ((undefined1 *)local_360._M_unused._0_8_ != local_350) {
      operator_delete(local_360._M_unused._M_object,local_350._0_8_ + 1);
    }
  }
  else {
    std::__cxx11::string::compare((char *)lang);
  }
  psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&local_298,psVar5);
  pVVar4 = Json::Value::operator[](&local_320,"dir-cur-bld");
  Json::Value::operator=(pVVar4,(Value *)&local_298);
  Json::Value::~Value((Value *)&local_298);
  psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&local_298,psVar5);
  pVVar4 = Json::Value::operator[](&local_320,"dir-cur-src");
  Json::Value::operator=(pVVar4,(Value *)&local_298);
  Json::Value::~Value((Value *)&local_298);
  psVar5 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&local_298,psVar5);
  pVVar4 = Json::Value::operator[](&local_320,"dir-top-bld");
  Json::Value::operator=(pVVar4,(Value *)&local_298);
  Json::Value::~Value((Value *)&local_298);
  psVar5 = cmMakefile::GetHomeDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&local_298,psVar5);
  pVVar4 = Json::Value::operator[](&local_320,"dir-top-src");
  Json::Value::operator=(pVVar4,(Value *)&local_298);
  Json::Value::~Value((Value *)&local_298);
  Json::Value::Value((Value *)&local_298,arrayValue);
  pVVar4 = Json::Value::operator[](&local_320,"include-dirs");
  pVVar4 = Json::Value::operator=(pVVar4,(Value *)&local_298);
  Json::Value::~Value((Value *)&local_298);
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this->LocalGenerator,&local_2d8,
             (this->super_cmCommonTargetGenerator).GeneratorTarget,lang,config);
  pbVar2 = local_2d8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    path = local_2d8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      psVar5 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar6,path);
      Json::Value::Value((Value *)&local_298,psVar5);
      Json::Value::append(pVVar4,(Value *)&local_298);
      Json::Value::~Value((Value *)&local_298);
      path = path + 1;
    } while (path != pbVar2);
  }
  Json::Value::Value((Value *)&local_298,arrayValue);
  pVVar4 = Json::Value::operator[](&local_320,"linked-target-dirs");
  pVVar4 = Json::Value::operator=(pVVar4,(Value *)&local_298);
  Json::Value::~Value((Value *)&local_298);
  cmCommonTargetGenerator::GetLinkedTargetDirectories
            ((LinkedTargetDirs *)local_390,&this->super_cmCommonTargetGenerator,lang,config);
  if (local_390._0_8_ != local_390._8_8_) {
    pSVar9 = (String *)local_390._0_8_;
    do {
      Json::Value::Value((Value *)&local_298,pSVar9);
      Json::Value::append(pVVar4,(Value *)&local_298);
      Json::Value::~Value((Value *)&local_298);
      pSVar9 = pSVar9 + 1;
    } while (pSVar9 != (String *)local_390._8_8_);
  }
  Json::Value::Value((Value *)&local_298,arrayValue);
  pVVar4 = Json::Value::operator[](&local_320,"forward-modules-from-target-dirs");
  pVVar4 = Json::Value::operator=(pVVar4,(Value *)&local_298);
  Json::Value::~Value((Value *)&local_298);
  if (local_380._8_8_ != local_370._M_allocated_capacity) {
    pSVar9 = (String *)local_380._8_8_;
    do {
      Json::Value::Value((Value *)&local_298,pSVar9);
      Json::Value::append(pVVar4,(Value *)&local_298);
      Json::Value::~Value((Value *)&local_298);
      pSVar9 = pSVar9 + 1;
    } while (pSVar9 != (String *)local_370._M_allocated_capacity);
  }
  local_360._8_8_ = 0;
  local_350._0_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cmSourceFile_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaTargetGenerator.cxx:2179:23)>
       ::_M_manager;
  local_350._8_8_ =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cmSourceFile_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaTargetGenerator.cxx:2179:23)>
       ::_M_invoke;
  local_340._8_8_ = 0;
  local_330 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cmSourceFile_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaTargetGenerator.cxx:2182:20)>
              ::_M_manager;
  pcStack_328 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cmSourceFile_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaTargetGenerator.cxx:2182:20)>
                ::_M_invoke;
  local_360._M_unused._M_object = this;
  local_340._M_unused._M_object = this;
  cmDyndepCollation::AddCollationInformation
            (&local_320,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
             (cmDyndepGeneratorCallbacks *)&local_360);
  GetTargetDependInfoPath(&local_2b8,this,lang,config);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)&local_298,&local_2b8,false,None);
  Json::operator<<((OStream *)&local_298,&local_320);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_330 != (code *)0x0) {
    (*local_330)(&local_340,&local_340,__destroy_functor);
  }
  if ((code *)local_350._0_8_ != (code *)0x0) {
    (*(code *)local_350._0_8_)(&local_360,&local_360,3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_380 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_390);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,
                    CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                             local_2f8.field_2._M_local_buf[0]) + 1);
  }
  Json::Value::~Value(&local_320);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteTargetDependInfo(std::string const& lang,
                                                   const std::string& config)
{
  Json::Value tdi(Json::objectValue);
  tdi["language"] = lang;
  tdi["compiler-id"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));
  tdi["compiler-simulate-id"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_SIMULATE_ID"));
  tdi["compiler-frontend-variant"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_FRONTEND_VARIANT"));

  std::string mod_dir;
  if (lang == "Fortran") {
    mod_dir = this->GeneratorTarget->GetFortranModuleDirectory(
      this->Makefile->GetHomeOutputDirectory());
  } else if (lang == "CXX") {
    mod_dir = this->GetGlobalGenerator()->ExpandCFGIntDir(
      cmSystemTools::CollapseFullPath(this->GeneratorTarget->ObjectDirectory),
      config);
  }
  if (mod_dir.empty()) {
    mod_dir = this->Makefile->GetCurrentBinaryDirectory();
  }
  tdi["module-dir"] = mod_dir;

  if (lang == "Fortran") {
    tdi["submodule-sep"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
    tdi["submodule-ext"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
  } else if (lang == "CXX") {
    // No extra information necessary.
  }

  tdi["dir-cur-bld"] = this->Makefile->GetCurrentBinaryDirectory();
  tdi["dir-cur-src"] = this->Makefile->GetCurrentSourceDirectory();
  tdi["dir-top-bld"] = this->Makefile->GetHomeOutputDirectory();
  tdi["dir-top-src"] = this->Makefile->GetHomeDirectory();

  Json::Value& tdi_include_dirs = tdi["include-dirs"] = Json::arrayValue;
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, config);
  for (std::string const& i : includes) {
    // Convert the include directories the same way we do for -I flags.
    // See upstream ninja issue 1251.
    tdi_include_dirs.append(this->ConvertToNinjaPath(i));
  }

  Json::Value& tdi_linked_target_dirs = tdi["linked-target-dirs"] =
    Json::arrayValue;
  auto const linked_directories =
    this->GetLinkedTargetDirectories(lang, config);
  for (std::string const& l : linked_directories.Direct) {
    tdi_linked_target_dirs.append(l);
  }

  Json::Value& tdi_forward_modules_from_target_dirs =
    tdi["forward-modules-from-target-dirs"] = Json::arrayValue;
  for (std::string const& l : linked_directories.Forward) {
    tdi_forward_modules_from_target_dirs.append(l);
  }

  cmDyndepGeneratorCallbacks cb;
  cb.ObjectFilePath = [this](cmSourceFile const* sf, std::string const& cnf) {
    return this->GetObjectFilePath(sf, cnf);
  };
  cb.BmiFilePath = [this](cmSourceFile const* sf, std::string const& cnf) {
    return this->GetBmiFilePath(sf, cnf);
  };

#if !defined(CMAKE_BOOTSTRAP)
  cmDyndepCollation::AddCollationInformation(tdi, this->GeneratorTarget,
                                             config, cb);
#endif

  std::string const tdin = this->GetTargetDependInfoPath(lang, config);
  cmGeneratedFileStream tdif(tdin);
  tdif << tdi;
}